

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall
TPZFMatrix<std::complex<float>_>::TPZFMatrix
          (TPZFMatrix<std::complex<float>_> *this,
          initializer_list<std::initializer_list<std::complex<float>_>_> *list)

{
  TPZRegisterClassId *in_RDI;
  initializer_list<std::initializer_list<std::complex<float>_>_> *in_stack_00000028;
  TPZFMatrix<std::complex<float>_> *in_stack_00000030;
  void **in_stack_ffffffffffffffc8;
  TPZMatrix<std::complex<float>_> *in_stack_ffffffffffffffd0;
  int64_t in_stack_ffffffffffffffd8;
  TPZManVector<int,_5> *this_00;
  
  this_00 = (TPZManVector<int,_5> *)0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZFMatrix<std::complex<float>>>(in_RDI,0x21);
  TPZMatrix<std::complex<float>_>::TPZMatrix(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *(undefined ***)in_RDI = &PTR__TPZFMatrix_023de238;
  TPZManVector<int,_5>::TPZManVector(this_00,in_stack_ffffffffffffffd8);
  TPZVec<std::complex<float>_>::TPZVec((TPZVec<std::complex<float>_> *)(in_RDI + 0x70));
  Initialize(in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const std::initializer_list<std::initializer_list<TVar>> &list)
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId)
{
    this->Initialize(list);
}